

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
          (ConstraintPrototypeSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *qualifiers,
          Token keyword,SyntaxList<slang::syntax::ClassSpecifierSyntax> *specifiers,NameSyntax *name
          ,Token semi)

{
  bool bVar1;
  reference ppCVar2;
  NameSyntax *pNVar3;
  SyntaxNode *in_RCX;
  TokenList *in_RDI;
  size_t in_R8;
  MemberSyntax *in_R9;
  ClassSpecifierSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *__range2;
  TokenList *this_00;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
  local_48;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc0;
  NameSyntax *in_stack_ffffffffffffffc8;
  
  this_00 = (TokenList *)&child;
  MemberSyntax::MemberSyntax
            (in_R9,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0)
  ;
  TokenList::TokenList(in_RDI,this_00);
  in_RDI[2].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RCX;
  in_RDI[2].super_SyntaxListBase.childCount = in_R8;
  SyntaxList<slang::syntax::ClassSpecifierSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_RDI,
             (SyntaxList<slang::syntax::ClassSpecifierSyntax> *)this_00);
  not_null<slang::syntax::NameSyntax_*>::not_null<slang::syntax::NameSyntax_*>
            ((not_null<slang::syntax::NameSyntax_*> *)
             &in_RDI[3].super_span<slang::parsing::Token,_18446744073709551615UL>,
             (NameSyntax **)&stack0xffffffffffffffc8);
  in_RDI[3].super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
       (size_t)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[4].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)*(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[1].super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)in_RDI;
  in_RDI[3].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  local_48._M_current =
       (ClassSpecifierSyntax **)
       std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> *)this_00);
  std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    ((*ppCVar2)->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ClassSpecifierSyntax_**,_std::span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  pNVar3 = not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0xa26288);
  (pNVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
  return;
}

Assistant:

ConstraintPrototypeSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& qualifiers, Token keyword, const SyntaxList<ClassSpecifierSyntax>& specifiers, NameSyntax& name, Token semi) :
        MemberSyntax(SyntaxKind::ConstraintPrototype, attributes), qualifiers(qualifiers), keyword(keyword), specifiers(specifiers), name(&name), semi(semi) {
        this->qualifiers.parent = this;
        this->specifiers.parent = this;
        for (auto child : this->specifiers)
            child->parent = this;
        this->name->parent = this;
    }